

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

QHash<QByteArray,_QByteArray> parseHttpOptionHeader(QByteArrayView header)

{
  byte bVar1;
  bool bVar2;
  storage_type *psVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  void *pvVar9;
  qsizetype qVar10;
  storage_type *in_RDX;
  ulong uVar11;
  uint uVar12;
  ulong in_RSI;
  long lVar13;
  QHash<QByteArray,QByteArray> *in_RDI;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  undefined1 auVar20 [16];
  QByteArray local_98;
  QByteArray local_80;
  QByteArray local_68;
  QByteArrayView local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0;
  uVar14 = 0;
  bVar4 = false;
  local_48.m_size = in_RSI;
  local_48.m_data = in_RDX;
LAB_00214c88:
  do {
    uVar11 = (ulong)(int)uVar14;
    uVar14 = local_48.m_size;
    if ((long)uVar11 < local_48.m_size) {
      do {
        uVar14 = uVar11;
        if ((0x20 < (ulong)(byte)local_48.m_data[uVar11]) ||
           ((0x100002600U >> ((ulong)(byte)local_48.m_data[uVar11] & 0x3f) & 1) == 0)) break;
        uVar11 = uVar11 + 1;
        uVar14 = local_48.m_size;
      } while (local_48.m_size != uVar11);
    }
    uVar16 = (uint)uVar14;
    uVar14 = (ulong)(int)uVar16;
    if (local_48.m_size == uVar14) goto LAB_00215043;
    qVar7 = QByteArrayView::indexOf(&local_48,',',uVar14);
    qVar8 = QByteArrayView::indexOf(&local_48,'=',uVar14);
    psVar3 = local_48.m_data;
    qVar10 = local_48.m_size;
    uVar12 = (uint)qVar7;
    if ((uVar16 == uVar12) || (uVar17 = (uint)qVar8, uVar16 == uVar17)) goto LAB_00215043;
    uVar6 = (uint)local_48.m_size;
    uVar5 = uVar12;
    if (uVar12 == 0xffffffff) {
      uVar5 = uVar6;
    }
    uVar15 = uVar17;
    if ((int)uVar5 < (int)uVar17) {
      uVar15 = uVar5;
    }
    if (uVar17 == 0xffffffff) {
      uVar15 = uVar5;
    }
    QVar19.m_size = (long)(int)(uVar15 - uVar16);
    QVar19.m_data = local_48.m_data + uVar14;
    auVar20 = QtPrivate::trimmed(QVar19);
    uVar14 = (ulong)(uVar15 + 1);
    if (uVar12 <= uVar17) {
      QByteArray::QByteArray(&local_80,auVar20._8_8_,auVar20._0_8_);
      QByteArray::toLower_helper(&local_68);
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char *)0x0;
      local_98.d.size = 0;
      QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>(in_RDI,&local_68,&local_98);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_00214c88;
    }
    uVar11 = (ulong)(int)(uVar15 + 1);
    if ((long)uVar11 < qVar10) {
      do {
        if ((0x20 < (ulong)(byte)psVar3[uVar11]) ||
           ((0x100002600U >> ((ulong)(byte)psVar3[uVar11] & 0x3f) & 1) == 0)) {
          uVar6 = (uint)uVar11;
          goto LAB_00214e56;
        }
        uVar11 = uVar11 + 1;
      } while (qVar10 != uVar11);
    }
    uVar11 = qVar10 & 0xffffffff;
LAB_00214e56:
    uVar18 = (ulong)(int)uVar6;
    lVar13 = qVar10 - uVar18;
    if (lVar13 == 0) goto LAB_00215043;
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char *)0x0;
    local_68.d.size = 0;
    if (lVar13 < 1) {
      lVar13 = 0;
    }
    QByteArray::reallocData((longlong)&local_68,(AllocationOption)lVar13);
    if ((&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_68.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_68.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_68.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if (local_48.m_data[uVar18] == '\"') {
      while( true ) {
        uVar16 = (int)uVar11 + 1;
        uVar14 = (ulong)uVar16;
        if (local_48.m_size <= (int)uVar16) break;
        if (local_48.m_data[(int)uVar16] == '\\') {
          uVar14 = (long)(int)uVar11 + 2;
          if (local_48.m_size <= (long)uVar14) goto LAB_00214ff4;
        }
        else if (local_48.m_data[(int)uVar16] == '\"') break;
        uVar11 = uVar14 & 0xffffffff;
        QByteArray::append((char)&local_68);
      }
    }
    else {
      uVar14 = uVar11 & 0xffffffff;
      if ((long)uVar18 < local_48.m_size) {
        do {
          bVar1 = local_48.m_data[uVar18];
          if ((((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
             (pvVar9 = memchr(parseHttpOptionHeader(QByteArrayView)::$_0::operator()(char)::
                              separators,(int)(char)bVar1,0x12), pvVar9 != (void *)0x0)) break;
          QByteArray::append((char)&local_68);
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < local_48.m_size);
        uVar14 = uVar18 & 0xffffffff;
      }
    }
    QByteArray::QByteArray(&local_98,auVar20._8_8_,auVar20._0_8_);
    QByteArray::toLower_helper(&local_80);
    QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>(in_RDI,&local_80,&local_68);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    qVar10 = QByteArrayView::indexOf(&local_48,',',(long)(int)uVar14);
    if ((int)qVar10 == -1) {
LAB_00214ff4:
      bVar4 = true;
      bVar2 = false;
    }
    else {
      bVar2 = true;
      uVar14 = (ulong)((int)qVar10 + 1);
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (!bVar2) {
      if (!bVar4) {
        QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)in_RDI);
      }
LAB_00215043:
      if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QHash<QByteArray,_QByteArray>)*(Data **)(in_FS_OFFSET + 0x28);
    }
  } while( true );
}

Assistant:

static QHash<QByteArray, QByteArray> parseHttpOptionHeader(QByteArrayView header)
{
    // The HTTP header is of the form:
    // header          = #1(directives)
    // directives      = token | value-directive
    // value-directive = token "=" (token | quoted-string)
    QHash<QByteArray, QByteArray> result;

    int pos = 0;
    while (true) {
        // skip spaces
        pos = nextNonWhitespace(header, pos);
        if (pos == header.size())
            return result;      // end of parsing

        // pos points to a non-whitespace
        int comma = header.indexOf(',', pos);
        int equal = header.indexOf('=', pos);
        if (comma == pos || equal == pos)
            // huh? Broken header.
            return result;

        // The key name is delimited by either a comma, an equal sign or the end
        // of the header, whichever comes first
        int end = comma;
        if (end == -1)
            end = header.size();
        if (equal != -1 && end > equal)
            end = equal;        // equal sign comes before comma/end
        const auto key = header.sliced(pos, end - pos).trimmed();
        pos = end + 1;

        if (uint(equal) < uint(comma)) {
            // case: token "=" (token | quoted-string)
            // skip spaces
            pos = nextNonWhitespace(header, pos);
            if (pos == header.size())
                // huh? Broken header
                return result;

            QByteArray value;
            value.reserve(header.size() - pos);
            if (header.at(pos) == '"') {
                // case: quoted-string
                // quoted-string  = ( <"> *(qdtext | quoted-pair ) <"> )
                // qdtext         = <any TEXT except <">>
                // quoted-pair    = "\" CHAR
                ++pos;
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (c == '"') {
                        // end of quoted text
                        break;
                    } else if (c == '\\') {
                        ++pos;
                        if (pos >= header.size())
                            // broken header
                            return result;
                        c = header.at(pos);
                    }

                    value += c;
                    ++pos;
                }
            } else {
                const auto isSeparator = [](char c) {
                    static const char separators[] = "()<>@,;:\\\"/[]?={}";
                    return isLWS(c) || strchr(separators, c) != nullptr;
                };

                // case: token
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (isSeparator(c))
                        break;
                    value += c;
                    ++pos;
                }
            }

            result.insert(key.toByteArray().toLower(), value);

            // find the comma now:
            comma = header.indexOf(',', pos);
            if (comma == -1)
                return result;  // end of parsing
            pos = comma + 1;
        } else {
            // case: token
            // key is already set
            result.insert(key.toByteArray().toLower(), QByteArray());
        }
    }
}